

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  IfcDistributionControlElement *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcDistributionControlElement");
  IfcDistributionElement::IfcDistributionElement
            ((IfcDistributionElement *)this,&PTR_construction_vtable_24__010c6390);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>,
             &PTR_construction_vtable_24__010c64c8);
  *(undefined8 *)this = 0x10c6260;
  *(undefined8 *)&this->field_0x180 = 0x10c6378;
  *(undefined8 *)&this->field_0x88 = 0x10c6288;
  *(undefined8 *)&this->field_0x98 = 0x10c62b0;
  *(undefined8 *)&this->field_0xd0 = 0x10c62d8;
  *(undefined8 *)&this->field_0x100 = 0x10c6300;
  *(undefined8 *)&this->field_0x138 = 0x10c6328;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x10c6350;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
         field_0x10);
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}